

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osifcnet.cpp
# Opt level: O3

size_t urlencodestr(char *dst,char *str)

{
  byte bVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar3 = 0;
  do {
    bVar1 = *str;
    uVar2 = bVar1 - 0x20;
    if (uVar2 < 0x3e) {
      if ((0x28000001ac009fdaU >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
        if ((ulong)uVar2 != 0) goto LAB_001fd81c;
        sVar4 = sVar3 + 1;
        if ((byte *)dst == (byte *)0x0) goto LAB_001fd830;
        *dst = 0x2b;
        goto LAB_001fd82b;
      }
      sVar4 = sVar3 + 3;
      if ((byte *)dst == (byte *)0x0) goto LAB_001fd830;
      sprintf(dst,"%%%02x");
      dst = (char *)((byte *)dst + 3);
    }
    else {
LAB_001fd81c:
      if (bVar1 == 0) {
        if ((byte *)dst != (byte *)0x0) {
          *dst = 0;
        }
        return sVar3;
      }
      sVar4 = sVar3 + 1;
      if ((byte *)dst == (byte *)0x0) {
LAB_001fd830:
        dst = (char *)0x0;
      }
      else {
        *dst = bVar1;
LAB_001fd82b:
        sVar4 = sVar3 + 1;
        dst = (char *)((byte *)dst + 1);
      }
    }
    str = (char *)((byte *)str + 1);
    sVar3 = sVar4;
  } while( true );
}

Assistant:

static size_t urlencodestr(char *dst, const char *str)
{
    size_t len;
    for (len = 0 ; *str != '\0' ; ++str)
    {
        switch (*str)
        {
        case '!':
        case '*':
        case '\'':
        case '(':
        case ')':
        case ';':
        case ':':
        case '@':
        case '&':
        case '=':
        case '+':
        case '$':
        case ',':
        case '/':
        case '?':
        case '#':
        case '[':
        case ']':
            /* encode these as % sequences */
            len += 3;
            if (dst != 0)
            {
                sprintf(dst, "%%%02x", (int)*str);
                dst += 3;
            }
            break;

        case ' ':
            /* encode space as '+' */
            ++len;
            if (dst != 0)
                *dst++ = '+';
            break;

        default:
            /* encode anything else as-is */
            ++len;
            if (dst != 0)
                *dst++ = *str;
            break;
        }
    }

    /* add a null terminator (but don't count it in the output length) */
    if (dst != 0)
        *dst = '\0';

    /* return the calculated length */
    return len;
}